

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O2

int slu_mmdelm_(int_t *mdnode,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *tag)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  shortint *psVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  shortint *psVar8;
  int iVar9;
  int iVar10;
  int_t iVar11;
  int iVar12;
  long lVar13;
  
  psVar8 = dforw + -1;
  marker[(long)*mdnode + -1] = *tag;
  iVar12 = xadj[(long)*mdnode + -1];
  iVar1 = xadj[*mdnode];
  iVar10 = iVar1 + -1;
  uVar6 = 0;
  for (lVar5 = (long)iVar12; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    uVar3 = adjncy[lVar5 + -1];
    lVar7 = (long)(int)uVar3;
    if (lVar7 == 0) break;
    if (marker[lVar7 + -1] < *tag) {
      marker[lVar7 + -1] = *tag;
      if (psVar8[lVar7] < 0) {
        llist[lVar7 + -1] = uVar6;
        uVar6 = uVar3;
      }
      else {
        adjncy[(long)iVar12 + -1] = uVar3;
        iVar12 = iVar12 + 1;
      }
    }
  }
LAB_0010c41f:
  if ((int)uVar6 < 1) {
    if (iVar12 <= iVar10) {
      adjncy[(long)iVar12 + -1] = 0;
    }
    iVar11 = *mdnode;
    do {
      lVar5 = (long)xadj[(long)iVar11 + -1];
      iVar12 = xadj[iVar11];
      while( true ) {
        if (iVar12 <= lVar5) {
          return 0;
        }
        iVar1 = adjncy[lVar5 + -1];
        lVar7 = (long)iVar1;
        if (lVar7 < 0) break;
        if (iVar1 == 0) {
          return 0;
        }
        uVar6 = dbakw[lVar7 + -1];
        if ((uVar6 != 0) && (*maxint + uVar6 != 0)) {
          iVar1 = psVar8[lVar7];
          if (0 < (long)iVar1) {
            dbakw[(long)iVar1 + -1] = uVar6;
          }
          uVar3 = -uVar6;
          if (0 < (int)uVar6) {
            uVar3 = uVar6;
          }
          psVar4 = dhead + -1;
          if (0 < (int)uVar6) {
            psVar4 = psVar8;
          }
          psVar4[uVar3] = iVar1;
        }
        iVar1 = xadj[lVar7 + -1];
        iVar10 = xadj[lVar7];
        iVar9 = iVar1;
        for (lVar13 = (long)iVar1; lVar13 < iVar10; lVar13 = lVar13 + 1) {
          iVar2 = adjncy[lVar13 + -1];
          if ((long)iVar2 == 0) break;
          if (marker[(long)iVar2 + -1] < *tag) {
            adjncy[(long)iVar9 + -1] = iVar2;
            iVar9 = iVar9 + 1;
          }
        }
        if (iVar9 - iVar1 == 0 || iVar9 < iVar1) {
          qsize[(long)*mdnode + -1] = qsize[(long)*mdnode + -1] + qsize[lVar7 + -1];
          qsize[lVar7 + -1] = 0;
          marker[lVar7 + -1] = *maxint;
          psVar8[lVar7] = -*mdnode;
          dbakw[lVar7 + -1] = -*maxint;
        }
        else {
          psVar8[lVar7] = (iVar9 - iVar1) + 1;
          dbakw[lVar7 + -1] = 0;
          adjncy[(long)iVar9 + -1] = *mdnode;
          if (iVar9 < iVar10 + -1) {
            adjncy[iVar9] = 0;
          }
        }
        lVar5 = lVar5 + 1;
      }
      iVar11 = -iVar1;
    } while( true );
  }
  adjncy[(long)iVar10 + -1] = -uVar6;
  uVar3 = uVar6;
LAB_0010c3a3:
  lVar5 = (long)xadj[(ulong)uVar3 - 1];
  iVar1 = xadj[uVar3];
  do {
    if (iVar1 <= lVar5) {
LAB_0010c418:
      uVar6 = llist[(ulong)uVar6 - 1];
      goto LAB_0010c41f;
    }
    iVar9 = adjncy[lVar5 + -1];
    lVar7 = (long)iVar9;
    if (lVar7 < 0) break;
    if (iVar9 == 0) goto LAB_0010c418;
    if ((marker[lVar7 + -1] < *tag) && (-1 < psVar8[lVar7])) {
      marker[lVar7 + -1] = *tag;
      for (; iVar10 <= iVar12; iVar10 = xadj[(long)(1 - adjncy[(long)iVar10 + -1]) + -1] + -1) {
        iVar12 = xadj[-1 - (long)adjncy[(long)iVar10 + -1]];
      }
      adjncy[(long)iVar12 + -1] = iVar9;
      iVar12 = iVar12 + 1;
    }
    lVar5 = lVar5 + 1;
  } while( true );
  uVar3 = -iVar9;
  goto LAB_0010c3a3;
}

Assistant:

int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr, 
	istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */


/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L300;
	}
	if (marker[nabor] >= *tag) {
	    goto L200;
	}
	marker[nabor] = *tag;
	if (dforw[nabor] < 0) {
	    goto L100;
	}
	adjncy[rloc] = nabor;
	++rloc;
	goto L200;
L100:
	llist[nabor] = elmnt;
	elmnt = nabor;
L200:
	;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
	goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
	node = adjncy[j];
	link = -node;
	if (node < 0) {
	    goto L400;
	} else if (node == 0) {
	    goto L900;
	} else {
	    goto L500;
	}
L500:
	if (marker[node] >= *tag || dforw[node] < 0) {
	    goto L800;
	}
	marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
	if (rloc < rlmt) {
	    goto L700;
	}
	link = -adjncy[rlmt];
	rloc = xadj[link];
	rlmt = xadj[link + 1] - 1;
	goto L600;
L700:
	adjncy[rloc] = node;
	++rloc;
L800:
	;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
	adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	rnode = adjncy[i];
	link = -rnode;
	if (rnode < 0) {
	    goto L1100;
	} else if (rnode == 0) {
	    goto L1800;
	} else {
	    goto L1200;
	}
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
	pvnode = dbakw[rnode];
	if (pvnode == 0 || pvnode == -(*maxint)) {
	    goto L1300;
	}
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
	nxnode = dforw[rnode];
	if (nxnode > 0) {
	    dbakw[nxnode] = pvnode;
	}
	if (pvnode > 0) {
	    dforw[pvnode] = nxnode;
	}
	npv = -pvnode;
	if (pvnode < 0) {
	    dhead[npv] = nxnode;
	}
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
	jstrt = xadj[rnode];
	jstop = xadj[rnode + 1] - 1;
	xqnbr = jstrt;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    nabor = adjncy[j];
	    if (nabor == 0) {
		goto L1500;
	    }
	    if (marker[nabor] >= *tag) {
		goto L1400;
	    }
	    adjncy[xqnbr] = nabor;
	    ++xqnbr;
L1400:
	    ;
	}
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
	nqnbrs = xqnbr - jstrt;
	if (nqnbrs > 0) {
	    goto L1600;
	}
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
	qsize[*mdnode] += qsize[rnode];
	qsize[rnode] = 0;
	marker[rnode] = *maxint;
	dforw[rnode] = -(*mdnode);
	dbakw[rnode] = -(*maxint);
	goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
	dforw[rnode] = nqnbrs + 1;
	dbakw[rnode] = 0;
	adjncy[xqnbr] = *mdnode;
	++xqnbr;
	if (xqnbr <= jstop) {
	    adjncy[xqnbr] = 0;
	}

L1700:
	;
    }
L1800:
    return 0;

}